

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereCheckIfBloomFilterIsUseful(WhereInfo *pWInfo)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Table *pTVar5;
  short sVar6;
  long lVar7;
  
  bVar1 = pWInfo->nLevel;
  if (1 < (ulong)bVar1) {
    sVar6 = (pWInfo->a[0].pWLoop)->nOut;
    lVar7 = 0;
    do {
      lVar4 = *(long *)((long)pWInfo[1].sWC.aStatic + lVar7 + -0x30);
      uVar2 = *(uint *)(lVar4 + 0x30);
      if ((uVar2 & 0x300) != 0 && (~uVar2 & 0x800001) == 0) {
        pTVar5 = pWInfo->pTabList->a[*(byte *)(lVar4 + 0x10)].pTab;
        uVar3 = pTVar5->tabFlags;
        pTVar5->tabFlags = uVar3 | 0x100;
        if ((pTVar5->nRowLogEst < sVar6) && ((uVar3 & 0x10) != 0)) {
          *(uint *)(lVar4 + 0x30) = uVar2 & 0xffbfffbf | 0x400000;
        }
      }
      sVar6 = sVar6 + *(short *)(lVar4 + 0x16);
      lVar7 = lVar7 + 0x70;
    } while ((ulong)bVar1 * 0x70 + -0x70 != lVar7);
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereCheckIfBloomFilterIsUseful(
  const WhereInfo *pWInfo
){
  int i;
  LogEst nSearch;

  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_BloomFilter) );
  nSearch = pWInfo->a[0].pWLoop->nOut;
  for(i=1; i<pWInfo->nLevel; i++){
    WhereLoop *pLoop = pWInfo->a[i].pWLoop;
    const unsigned int reqFlags = (WHERE_SELFCULL|WHERE_COLUMN_EQ);
    if( (pLoop->wsFlags & reqFlags)==reqFlags
     /* vvvvvv--- Always the case if WHERE_COLUMN_EQ is defined */
     && ALWAYS((pLoop->wsFlags & (WHERE_IPK|WHERE_INDEXED))!=0)
    ){
      SrcItem *pItem = &pWInfo->pTabList->a[pLoop->iTab];
      Table *pTab = pItem->pTab;
      pTab->tabFlags |= TF_StatsUsed;
      if( nSearch > pTab->nRowLogEst
       && (pTab->tabFlags & TF_HasStat1)!=0
      ){
        testcase( pItem->fg.jointype & JT_LEFT );
        pLoop->wsFlags |= WHERE_BLOOMFILTER;
        pLoop->wsFlags &= ~WHERE_IDX_ONLY;
        WHERETRACE(0xffff, (
           "-> use Bloom-filter on loop %c because there are ~%.1e "
           "lookups into %s which has only ~%.1e rows\n",
           pLoop->cId, (double)sqlite3LogEstToInt(nSearch), pTab->zName,
           (double)sqlite3LogEstToInt(pTab->nRowLogEst)));
      }
    }
    nSearch += pLoop->nOut;
  }
}